

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumDefinition
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar1 = Consume(this,"enum");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&local_40,enum_location,1);
    LocationRecorder::RecordLegacyLocation(&local_40,&enum_type->super_Message,NAME);
    *(byte *)(enum_type->_has_bits_).has_bits_ = (byte)(enum_type->_has_bits_).has_bits_[0] | 1;
    if ((enum_type->name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena
                (&enum_type->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    bVar1 = ConsumeIdentifier(this,(enum_type->name_).ptr_,"Expected enum name.");
    LocationRecorder::~LocationRecorder(&local_40);
    if ((bVar1) && (bVar1 = ParseEnumBlock(this,enum_type,enum_location,containing_file), bVar1)) {
      bVar1 = ValidateEnum(this,enum_type);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseEnumDefinition(EnumDescriptorProto* enum_type,
                                 const LocationRecorder& enum_location,
                                 const FileDescriptorProto* containing_file) {
  DO(Consume("enum"));

  {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        enum_type, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_type->mutable_name(), "Expected enum name."));
  }

  DO(ParseEnumBlock(enum_type, enum_location, containing_file));

  DO(ValidateEnum(enum_type));

  return true;
}